

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasFoodWeb_bnd.c
# Opt level: O3

int resweb(sunrealtype tt,N_Vector cc,N_Vector cp,N_Vector res,void *user_data)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  sunrealtype tcalc;
  
  lVar3 = N_VGetArrayPointer(cp);
  lVar4 = N_VGetArrayPointer(res);
  lVar1 = *(long *)((long)user_data + 0x10);
  Fweb(tcalc,cc,res,(UserData)user_data);
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar8 = 0;
      bVar2 = true;
      do {
        bVar7 = bVar2;
        uVar9 = uVar8 | lVar5 * 0x28 + lVar6 * 2;
        if ((long)uVar8 < lVar1) {
          *(double *)(lVar4 + uVar9 * 8) =
               *(double *)(lVar3 + uVar9 * 8) - *(double *)(lVar4 + uVar9 * 8);
        }
        else {
          *(ulong *)(lVar4 + uVar9 * 8) = *(ulong *)(lVar4 + uVar9 * 8) ^ 0x8000000000000000;
        }
        uVar8 = 1;
        bVar2 = false;
      } while (bVar7);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x14);
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x14);
  return 0;
}

Assistant:

static int resweb(sunrealtype tt, N_Vector cc, N_Vector cp, N_Vector res,
                  void* user_data)
{
  sunindextype jx, jy, is, yloc, loc, np;
  sunrealtype *resv, *cpv;
  UserData webdata;

  webdata = (UserData)user_data;

  cpv  = N_VGetArrayPointer(cp);
  resv = N_VGetArrayPointer(res);
  np   = webdata->np;

  /* Call Fweb to set res to vector of right-hand sides. */
  Fweb(tt, cc, res, webdata);

  /* Loop over all grid points, setting residual values appropriately
     for differential or algebraic components.                        */

  for (jy = 0; jy < MY; jy++)
  {
    yloc = NSMX * jy;
    for (jx = 0; jx < MX; jx++)
    {
      loc = yloc + NUM_SPECIES * jx;
      for (is = 0; is < NUM_SPECIES; is++)
      {
        if (is < np) { resv[loc + is] = cpv[loc + is] - resv[loc + is]; }
        else { resv[loc + is] = -resv[loc + is]; }
      }
    }
  }

  return (0);
}